

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O1

bool __thiscall sjtu::TrainManager::buy_ticket(TrainManager *this,orderType *order)

{
  char (*pacVar1) [41];
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  orderType *poVar2;
  int iVar3;
  int iVar4;
  orderstatus oVar5;
  size_t sVar6;
  undefined4 extraout_var;
  long lVar7;
  bool bVar8;
  char *__s;
  stationType *__s_00;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  pair<long,_bool> pVar17;
  timeType local_118;
  long local_108 [2];
  orderType *local_f8;
  long *local_f0;
  size_t local_e8;
  long local_e0 [2];
  char (*local_d0) [41];
  long *local_c8;
  size_t sStack_c0;
  TrainManager *local_b8;
  ulong local_b0;
  uint local_a4;
  timeType *local_a0;
  char (*local_98) [41];
  int *local_90;
  char (*local_88) [41];
  long *local_80;
  long local_78;
  long local_70 [2];
  long local_60;
  char local_58;
  string local_50;
  trainType *this_01;
  
  this_00 = this->TrainBpTree;
  local_80 = local_70;
  sVar6 = strlen(order->trainID);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,order->trainID,order->trainID + sVar6);
  if (local_78 == 0) {
    local_118._0_8_ = (long *)0x0;
  }
  else {
    lVar10 = 0;
    lVar7 = 0;
    uVar9 = 0;
    do {
      uVar12 = (ulong)((int)*(char *)((long)local_80 + lVar10) + 0x100);
      lVar7 = (long)(lVar7 * 0x239 + uVar12) % 0x3b800001;
      uVar9 = (long)(uVar9 * 0x301 + uVar12) % 0x3b9aca07;
      lVar10 = lVar10 + 1;
    } while (local_78 != lVar10);
    local_118._0_8_ = lVar7 << 0x20 | uVar9;
  }
  pVar17 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,(unsigned_long_long *)&local_118);
  local_60 = pVar17.first;
  local_58 = pVar17.second;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_58 != '\0') {
    local_b8 = this;
    iVar3 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                      (this->TrainFile,&local_60);
    this_01 = (trainType *)CONCAT44(extraout_var,iVar3);
    local_d0 = (char (*) [41])CONCAT44(local_d0._4_4_,order->num);
    local_a0 = order->date;
    iVar3 = timeType::dateminus(local_a0,this_01->saleDate);
    pacVar1 = order->station;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar6 = strlen(*pacVar1);
    local_f8 = order;
    local_98 = pacVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pacVar1,order->station[0] + sVar6);
    iVar4 = trainType::get_Delta_date(this_01,&local_50);
    uVar11 = iVar4 + iVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    poVar2 = local_f8;
    if ((((-1 < (int)uVar11) &&
         (iVar3 = timeType::dateminus(this_01->saleDate + 1,this_01->saleDate), (int)uVar11 <= iVar3
         )) && (this_01->is_released != false)) && (poVar2->num <= this_01->seatNum)) {
      sStack_c0._0_4_ = (this_01->startTime).hour;
      sStack_c0._4_4_ = (this_01->startTime).minute;
      local_c8 = *(long **)local_a0;
      bVar15 = 0 < this_01->stationNum;
      local_a4 = uVar11;
      if (this_01->stationNum < 1) {
        bVar8 = false;
      }
      else {
        local_b0 = 0;
        local_88 = local_f8->station + 1;
        local_90 = this_01->stations[0].seatNum + uVar11;
        lVar7 = 0;
        lVar10 = 0;
        bVar8 = false;
        do {
          if (lVar7 != 0) {
            timeType::operator+(&local_118,(int *)&local_c8);
            local_c8 = (long *)local_118._0_8_;
            sStack_c0._0_4_ = local_118.hour;
            sStack_c0._4_4_ = local_118.minute;
          }
          if (bVar8) {
            local_b0 = (ulong)(uint)((int)local_b0 +
                                    *(int *)((long)&this_01->stations[0].price + lVar7));
            iVar3 = (int)local_d0;
            if (*(int *)((long)local_90 + lVar7) <= (int)local_d0) {
              iVar3 = *(int *)((long)local_90 + lVar7);
            }
            local_d0 = (char (*) [41])CONCAT44(local_d0._4_4_,iVar3);
          }
          __s = this_01->stations[0].stationName + lVar7;
          local_118._0_8_ = local_108;
          sVar6 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,__s,this_01->stations[0].stationName + sVar6 + lVar7);
          pacVar1 = local_88;
          local_f0 = local_e0;
          sVar6 = strlen(*local_88);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,pacVar1,*pacVar1 + sVar6);
          if (local_118._8_8_ == local_e8) {
            if (local_118._8_8_ == 0) {
              bVar14 = true;
            }
            else {
              iVar3 = bcmp((void *)local_118._0_8_,local_f0,local_118._8_8_);
              bVar14 = iVar3 == 0;
            }
          }
          else {
            bVar14 = false;
          }
          if (local_f0 != local_e0) {
            operator_delete(local_f0,local_e0[0] + 1);
          }
          if ((long *)local_118._0_8_ != local_108) {
            operator_delete((void *)local_118._0_8_,local_108[0] + 1);
          }
          if (bVar14) {
            *(long **)(local_f8->date + 1) = local_c8;
            local_f8->date[1].hour = (undefined4)sStack_c0;
            local_f8->date[1].minute = sStack_c0._4_4_;
            local_f8->price = (int)local_b0;
            break;
          }
          if (lVar7 != 0) {
            timeType::operator+(&local_118,(int *)&local_c8);
            local_c8 = (long *)local_118._0_8_;
            sStack_c0._0_4_ = local_118.hour;
            sStack_c0._4_4_ = local_118.minute;
          }
          local_118._0_8_ = local_108;
          sVar6 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,__s,this_01->stations[0].stationName + sVar6 + lVar7);
          pacVar1 = local_98;
          local_f0 = local_e0;
          sVar6 = strlen(*local_98);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,pacVar1,*pacVar1 + sVar6);
          if (local_118._8_8_ == local_e8) {
            if (local_118._8_8_ == 0) {
              bVar15 = true;
            }
            else {
              iVar3 = bcmp((void *)local_118._0_8_,local_f0,local_118._8_8_);
              bVar15 = iVar3 == 0;
            }
          }
          else {
            bVar15 = false;
          }
          if (local_f0 != local_e0) {
            operator_delete(local_f0,local_e0[0] + 1);
          }
          if ((long *)local_118._0_8_ != local_108) {
            operator_delete((void *)local_118._0_8_,local_108[0] + 1);
          }
          if (bVar15) {
            local_c8 = *(long **)local_a0;
            *(long **)local_a0 = local_c8;
            local_a0->hour = (undefined4)sStack_c0;
            local_a0->minute = sStack_c0._4_4_;
            bVar8 = true;
          }
          lVar10 = lVar10 + 1;
          lVar7 = lVar7 + 0x1a8;
          bVar15 = lVar10 < this_01->stationNum;
        } while (lVar10 < this_01->stationNum);
      }
      if ((bool)(bVar8 & bVar15) == false) {
        return false;
      }
      oVar5 = pending;
      if ((int)local_d0 == local_f8->num) {
        if (this_01->stationNum < 1) {
          oVar5 = success;
        }
        else {
          __s_00 = this_01->stations;
          local_d0 = local_f8->station + 1;
          piVar13 = this_01->stations[0].seatNum + local_a4;
          lVar7 = 0;
          bVar14 = false;
          do {
            if (bVar14) {
              *piVar13 = *piVar13 - local_f8->num;
            }
            local_118._0_8_ = local_108;
            sVar6 = strlen(__s_00->stationName);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,__s_00,__s_00->stationName + sVar6);
            pacVar1 = local_d0;
            local_f0 = local_e0;
            sVar6 = strlen(*local_d0);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,pacVar1,*pacVar1 + sVar6);
            if (local_118._8_8_ == local_e8) {
              if (local_118._8_8_ == 0) {
                bVar16 = true;
              }
              else {
                iVar3 = bcmp((void *)local_118._0_8_,local_f0,local_118._8_8_);
                bVar16 = iVar3 == 0;
              }
            }
            else {
              bVar16 = false;
            }
            if (local_f0 != local_e0) {
              operator_delete(local_f0,local_e0[0] + 1);
            }
            if ((long *)local_118._0_8_ != local_108) {
              operator_delete((void *)local_118._0_8_,local_108[0] + 1);
            }
            if (bVar16) break;
            local_118._0_8_ = local_108;
            sVar6 = strlen(__s_00->stationName);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,__s_00,__s_00->stationName + sVar6);
            pacVar1 = local_98;
            local_f0 = local_e0;
            sVar6 = strlen(*local_98);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,pacVar1,*pacVar1 + sVar6);
            if (local_118._8_8_ == local_e8) {
              if (local_118._8_8_ == 0) {
                bVar16 = true;
              }
              else {
                iVar3 = bcmp((void *)local_118._0_8_,local_f0,local_118._8_8_);
                bVar16 = iVar3 == 0;
              }
            }
            else {
              bVar16 = false;
            }
            if (local_f0 != local_e0) {
              operator_delete(local_f0,local_e0[0] + 1);
            }
            if ((long *)local_118._0_8_ != local_108) {
              operator_delete((void *)local_118._0_8_,local_108[0] + 1);
            }
            if (bVar16) {
              bVar14 = true;
            }
            lVar7 = lVar7 + 1;
            piVar13 = piVar13 + 0x6a;
            __s_00 = __s_00 + 1;
          } while (lVar7 < this_01->stationNum);
          oVar5 = success;
        }
      }
      local_f8->status = oVar5;
      (*(local_b8->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
                (local_b8->TrainFile,&this_01->offset);
      return (bool)(bVar8 & bVar15);
    }
  }
  return false;
}

Assistant:

bool TrainManager::buy_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		if (ret.second == false) return 0;
		else
		{
			trainType *train = TrainFile -> read(ret.first);
			int min_ticket_num = order -> num , day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0])) , single_ticket_price = 0;
			if (day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0]) || train -> is_released == false || order -> num > train -> seatNum) return 0;
			else
			{
				timeType current_time = train -> startTime;
				current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
				bool flag = false , end_flag = false;
				for (int i = 0;i < train -> stationNum;++ i)
				{
					if (i) current_time = current_time + train -> stations[i].travelTime;
					if (flag) single_ticket_price += train -> stations[i].price , min_ticket_num = min(min_ticket_num , train -> stations[i].seatNum[day_id]);
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[1]))
					{
						order -> date[1] = current_time , order -> price = single_ticket_price , end_flag = true;
						break;
					}
					if (i) current_time = current_time + train -> stations[i].stopoverTime;
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[0]))
					{
						current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
						order -> date[0] = current_time , flag = true;
					}
				}
				if (!flag || !end_flag) return false;
				if (min_ticket_num == order -> num)
				{
					flag = false;
					for (int i = 0;i < train -> stationNum;++ i)
					{
						if (flag) train -> stations[i].seatNum[day_id] -= order -> num;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
					}
					order -> status = success;
				}
				else order -> status = pending;
				TrainFile -> save(train -> offset);
				return true;
			}
		}
	}